

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O0

ggml_tensor * __thiscall test_sqr::build_graph(test_sqr *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  test_case *in_RSI;
  long in_RDI;
  ggml_tensor *out;
  ggml_tensor *a;
  undefined4 in_stack_ffffffffffffffd8;
  undefined4 uVar2;
  undefined8 in_stack_ffffffffffffffe0;
  ggml_context *in_stack_ffffffffffffffe8;
  
  uVar2 = *(undefined4 *)(in_RDI + 0x38);
  std::array<long,_4UL>::data((array<long,_4UL> *)0x19e611);
  pgVar1 = test_case::ggml_new_tensor
                     (in_RSI,in_stack_ffffffffffffffe8,
                      (ggml_type)((ulong)in_stack_ffffffffffffffe0 >> 0x20),
                      (int)in_stack_ffffffffffffffe0,
                      (int64_t *)CONCAT44(uVar2,in_stack_ffffffffffffffd8));
  ggml_set_param(in_RSI,pgVar1);
  ggml_set_name(pgVar1,"a");
  pgVar1 = (ggml_tensor *)ggml_sqr(in_RSI,pgVar1);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * a = ggml_new_tensor(ctx, type, 4, ne.data());
        ggml_set_param(ctx, a);
        ggml_set_name(a, "a");

        ggml_tensor * out = ggml_sqr(ctx, a);
        ggml_set_name(out, "out");

        return out;
    }